

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O0

void Assimp::ArmaturePopulate::BuildBoneList
               (aiNode *current_node,aiNode *root_node,aiScene *scene,
               vector<aiBone_*,_std::allocator<aiBone_*>_> *bones)

{
  bool bVar1;
  __normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_> local_78;
  aiBone **local_70;
  __normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_> local_68;
  __normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_> local_60;
  aiBone *local_58;
  aiBone *bone;
  aiBone *paStack_48;
  uint boneId;
  aiMesh *mesh;
  uint mesh_index;
  uint meshId;
  aiNode *child;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *pvStack_28;
  uint nodeId;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *bones_local;
  aiScene *scene_local;
  aiNode *root_node_local;
  aiNode *current_node_local;
  
  pvStack_28 = bones;
  bones_local = (vector<aiBone_*,_std::allocator<aiBone_*>_> *)scene;
  scene_local = (aiScene *)root_node;
  root_node_local = current_node;
  if (scene == (aiScene *)0x0) {
    __assert_fail("scene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0x70,
                  "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                 );
  }
  child._4_4_ = 0;
  do {
    if (root_node_local->mNumChildren <= child._4_4_) {
      return;
    }
    _mesh_index = root_node_local->mChildren[child._4_4_];
    if (_mesh_index == (aiNode *)0x0) {
      __assert_fail("child",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                    ,0x73,
                    "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                   );
    }
    for (mesh._4_4_ = 0; mesh._4_4_ < _mesh_index->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
      if (_mesh_index->mMeshes == (uint *)0x0) {
        __assert_fail("child->mMeshes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                      ,0x77,
                      "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                     );
      }
      mesh._0_4_ = _mesh_index->mMeshes[mesh._4_4_];
      paStack_48 = bones_local[1].super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)mesh];
      if (paStack_48 == (aiBone *)0x0) {
        __assert_fail("mesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                      ,0x7a,
                      "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                     );
      }
      for (bone._4_4_ = 0; bone._4_4_ < *(uint *)((paStack_48->mName).data + 0xd4);
          bone._4_4_ = bone._4_4_ + 1) {
        local_58 = *(aiBone **)(*(long *)((paStack_48->mName).data + 0xdc) + (ulong)bone._4_4_ * 8);
        if (local_58 == (aiBone *)0x0) {
          __assert_fail("bone",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                        ,0x7e,
                        "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                       );
        }
        local_68._M_current =
             (aiBone **)std::vector<aiBone_*,_std::allocator<aiBone_*>_>::begin(pvStack_28);
        local_70 = (aiBone **)std::vector<aiBone_*,_std::allocator<aiBone_*>_>::end(pvStack_28);
        local_60 = std::
                   find<__gnu_cxx::__normal_iterator<aiBone**,std::vector<aiBone*,std::allocator<aiBone*>>>,aiBone*>
                             (local_68,(__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>
                                        )local_70,&local_58);
        local_78._M_current =
             (aiBone **)std::vector<aiBone_*,_std::allocator<aiBone_*>_>::end(pvStack_28);
        bVar1 = __gnu_cxx::operator==(&local_60,&local_78);
        if (bVar1) {
          std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(pvStack_28,&local_58);
        }
      }
    }
    BuildBoneList(_mesh_index,(aiNode *)scene_local,(aiScene *)bones_local,pvStack_28);
    child._4_4_ = child._4_4_ + 1;
  } while( true );
}

Assistant:

void ArmaturePopulate::BuildBoneList(aiNode *current_node,
                                     const aiNode *root_node,
                                     const aiScene *scene,
                                     std::vector<aiBone *> &bones) {
  ai_assert(scene);
  for (unsigned int nodeId = 0; nodeId < current_node->mNumChildren; ++nodeId) {
    aiNode *child = current_node->mChildren[nodeId];
    ai_assert(child);

    // check for bones
    for (unsigned int meshId = 0; meshId < child->mNumMeshes; ++meshId) {
      ai_assert(child->mMeshes);
      unsigned int mesh_index = child->mMeshes[meshId];
      aiMesh *mesh = scene->mMeshes[mesh_index];
      ai_assert(mesh);

      for (unsigned int boneId = 0; boneId < mesh->mNumBones; ++boneId) {
        aiBone *bone = mesh->mBones[boneId];
        ai_assert(bone);

        // duplicate meshes exist with the same bones sometimes :)
        // so this must be detected
        if (std::find(bones.begin(), bones.end(), bone) == bones.end()) {
          // add the element once
          bones.push_back(bone);
        }
      }

      // find mesh and get bones
      // then do recursive lookup for bones in root node hierarchy
    }

    BuildBoneList(child, root_node, scene, bones);
  }
}